

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMDocumentImpl::~DOMDocumentImpl(DOMDocumentImpl *this)

{
  void *in_RSI;
  
  ~DOMDocumentImpl((DOMDocumentImpl *)&this[-1].fRanges);
  XMemory::operator_delete((XMemory *)&this[-1].fRanges,in_RSI);
  return;
}

Assistant:

DOMDocumentImpl::~DOMDocumentImpl()
{
    // While DOMConfiguration is allocated on the Document's heap, itself
    // it uses the memory manager directly. This means that while we cannot
    // delete with operator delete, we need to call its d-tor.
    //
    if (fDOMConfiguration)
      fDOMConfiguration->~DOMConfiguration ();

    //  Clean up the fNodeListPool
    if (fNodeListPool)
        fNodeListPool->cleanup();

    if (fRanges)
        delete fRanges; //fRanges->cleanup();

    if (fNodeIterators)
        delete fNodeIterators;//fNodeIterators->cleanup();

    if (fUserDataTable)
        delete fUserDataTable;//fUserDataTable->cleanup();

    if (fRecycleNodePtr) {
        fRecycleNodePtr->deleteAllElements();
        delete fRecycleNodePtr;
    }

    if (fRecycleBufferPtr) {
        delete fRecycleBufferPtr;
    }

    delete fNormalizer;

    //  Delete the heap for this document.  This uncerimoniously yanks the storage
    //      out from under all of the nodes in the document.  Destructors are NOT called.
    this->deleteHeap();
}